

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_add.cxx
# Opt level: O0

int __thiscall Fl_Menu_::add(Fl_Menu_ *this,char *str)

{
  bool bVar1;
  int *local_428;
  char *c;
  int sc;
  int r;
  char buf [1024];
  char *str_local;
  Fl_Menu_ *this_local;
  
  c._4_4_ = 0;
  buf._1016_8_ = str;
  while (*(char *)buf._1016_8_ != '\0') {
    c._0_4_ = 0;
    local_428 = &sc;
    while( true ) {
      bVar1 = false;
      if ((local_428 < buf + 0x3f6) && (bVar1 = false, *(char *)buf._1016_8_ != '\0')) {
        bVar1 = *(char *)buf._1016_8_ != '|';
      }
      if (!bVar1) break;
      if (*(char *)buf._1016_8_ == '\t') {
        *(undefined1 *)local_428 = 0;
        c._0_4_ = fl_old_shortcut((char *)buf._1016_8_);
      }
      else {
        *(undefined1 *)local_428 = *(undefined1 *)buf._1016_8_;
      }
      local_428 = (int *)((long)local_428 + 1);
      buf._1016_8_ = buf._1016_8_ + 1;
    }
    *(undefined1 *)local_428 = 0;
    c._4_4_ = add(this,(char *)&sc,(uint)c,(Fl_Callback *)0x0,(void *)0x0,0);
    if (*(char *)buf._1016_8_ != '\0') {
      buf._1016_8_ = buf._1016_8_ + 1;
    }
  }
  return c._4_4_;
}

Assistant:

int Fl_Menu_::add(const char *str) {
  char buf[1024];
  int r = 0;
  while (*str) {
    int sc = 0;
    char *c;
    for (c = buf; c < (buf + sizeof(buf) - 2) && *str && *str != '|'; str++) {
      if (*str == '\t') {*c++ = 0; sc = fl_old_shortcut(str);}
      else *c++ = *str;
    }
    *c = 0;
    r = add(buf, sc, 0, 0, 0);
    if (*str) str++;
  }
  return r;
}